

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O2

void __thiscall
charls::jpeg_stream_writer::write_application_data_segment
          (jpeg_stream_writer *this,int32_t application_data_id,const_byte_span application_data)

{
  if ((uint)application_data_id < 0x10) {
    write_segment_header
              (this,(jpeg_marker_code)application_data_id | application_data0,application_data.size_
              );
    write_bytes(this,application_data.data_,application_data.size_);
    return;
  }
  __assert_fail("application_data_id >= minimum_application_data_id && application_data_id <= maximum_application_data_id"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                ,0x8c,
                "void charls::jpeg_stream_writer::write_application_data_segment(const int32_t, const const_byte_span)"
               );
}

Assistant:

void jpeg_stream_writer::write_application_data_segment(const int32_t application_data_id, const const_byte_span application_data)
{
    ASSERT(application_data_id >= minimum_application_data_id && application_data_id <= maximum_application_data_id);

    write_segment_header(
        static_cast<jpeg_marker_code>(static_cast<int32_t>(jpeg_marker_code::application_data0) + application_data_id),
        application_data.size());
    write_bytes(application_data);
}